

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

If_DsdMan_t * If_DsdManAlloc(int nVars,int LutSize)

{
  word wVar1;
  int iVar2;
  If_DsdMan_t *p;
  char *pcVar3;
  uint *puVar4;
  Mem_Flex_t *pMVar5;
  If_DsdObj_t *pIVar6;
  Vec_Int_t *pVVar7;
  Vec_Mem_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  int *piVar11;
  void *pvVar12;
  undefined8 *puVar13;
  int i;
  ulong uVar14;
  int **ppiVar15;
  long lVar16;
  long lVar17;
  char pFileName [100];
  
  if (nVars < 0xd) {
    sprintf(pFileName,"%02d.dsd",(ulong)(uint)nVars);
    p = (If_DsdMan_t *)calloc(1,0x2d0);
    pcVar3 = Abc_UtilStrsav(pFileName);
    p->pStore = pcVar3;
    p->nVars = nVars;
    p->LutSize = LutSize;
    iVar2 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      iVar2 = 1;
    }
    p->nWords = iVar2;
    iVar2 = Abc_PrimeCudd(100000);
    p->nBins = iVar2;
    puVar4 = (uint *)calloc((long)iVar2,4);
    p->pBins = puVar4;
    pMVar5 = Mem_FlexStart();
    p->pMem = pMVar5;
    p->nConfigWords = 1;
    Vec_PtrGrow(&p->vObjs,10000);
    Vec_IntGrow(&p->vNexts,10000);
    Vec_IntGrow(&p->vTruths,10000);
    If_DsdObjAlloc(p,1,0);
    pIVar6 = If_DsdObjAlloc(p,2,0);
    *(uint *)&pIVar6->field_0x4 = *(uint *)&pIVar6->field_0x4 & 0xffffff07 | 8;
    pVVar7 = Vec_IntAlloc(0x20);
    p->vTemp1 = pVVar7;
    pVVar7 = Vec_IntAlloc(0x20);
    p->vTemp2 = pVVar7;
    if (If_ManDsdTtElems_pTtElems == 0) {
      puVar13 = &If_ManDsdTtElems_TtElems;
      for (lVar17 = 0; lVar17 != 0x68; lVar17 = lVar17 + 8) {
        *(undefined8 **)((long)&If_ManDsdTtElems_pTtElems + lVar17) = puVar13;
        puVar13 = puVar13 + 0x40;
      }
      for (uVar14 = 0; uVar14 != 0xc; uVar14 = uVar14 + 1) {
        if (uVar14 < 6) {
          wVar1 = s_Truths6[uVar14];
          lVar17 = (&If_ManDsdTtElems_pTtElems)[uVar14];
          for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 1) {
            *(word *)(lVar17 + lVar16 * 8) = wVar1;
          }
        }
        else {
          lVar17 = (&If_ManDsdTtElems_pTtElems)[uVar14];
          for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 1) {
            *(ulong *)(lVar17 + lVar16 * 8) =
                 -(ulong)((1 << ((char)uVar14 - 6U & 0x1f) & (uint)lVar16) != 0);
          }
        }
      }
    }
    p->pTtElems = (word **)&If_ManDsdTtElems_pTtElems;
    for (lVar17 = 0; (long)(lVar17 + 3U) <= (long)nVars; lVar17 = lVar17 + 1) {
      iVar2 = 1 << ((char)lVar17 - 3U & 0x1f);
      if (lVar17 + 3U < 7) {
        iVar2 = 1;
      }
      pVVar8 = (Vec_Mem_t *)calloc(1,0x30);
      pVVar8->nEntrySize = iVar2;
      pVVar8->LogPageSze = 0xc;
      pVVar8->PageMask = 0xfff;
      pVVar8->iPage = -1;
      p->vTtMem[lVar17 + 3] = pVVar8;
      iVar2 = Abc_PrimeCudd(10000);
      pVVar7 = Vec_IntStartFull(iVar2);
      pVVar8->vTable = pVVar7;
      pVVar7 = Vec_IntAlloc(10000);
      pVVar8->vNexts = pVVar7;
      pVVar9 = (Vec_Ptr_t *)malloc(0x10);
      pVVar9->nCap = 1000;
      pVVar9->nSize = 0;
      ppvVar10 = (void **)malloc(8000);
      pVVar9->pArray = ppvVar10;
      p->vTtDecs[lVar17 + 3] = pVVar9;
    }
    ppiVar15 = p->pSched + 2;
    for (lVar17 = 2; lVar17 < nVars; lVar17 = lVar17 + 1) {
      piVar11 = Extra_GreyCodeSchedule((int)lVar17);
      *ppiVar15 = piVar11;
      ppiVar15 = ppiVar15 + 1;
    }
    if (LutSize != 0) {
      pvVar12 = If_ManSatBuildXY(LutSize);
      p->pSat = pvVar12;
    }
    pVVar7 = Vec_IntAlloc(0);
    p->vCover = pVVar7;
    return p;
  }
  __assert_fail("nVars <= DAU_MAX_VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x10c,"If_DsdMan_t *If_DsdManAlloc(int, int)");
}

Assistant:

If_DsdMan_t * If_DsdManAlloc( int nVars, int LutSize )
{
    If_DsdMan_t * p; int v;
    char pFileName[100];
    assert( nVars <= DAU_MAX_VAR );
    sprintf( pFileName, "%02d.dsd", nVars );
    p = ABC_CALLOC( If_DsdMan_t, 1 );
    p->pStore  = Abc_UtilStrsav( pFileName );
    p->nVars   = nVars;
    p->LutSize = LutSize;
    p->nWords  = Abc_TtWordNum( nVars );
    p->nBins   = Abc_PrimeCudd( 100000 );
    p->pBins   = ABC_CALLOC( unsigned, p->nBins );
    p->pMem    = Mem_FlexStart();
    p->nConfigWords = 1;
    Vec_PtrGrow( &p->vObjs, 10000 );
    Vec_IntGrow( &p->vNexts, 10000 );
    Vec_IntGrow( &p->vTruths, 10000 );
    If_DsdObjAlloc( p, IF_DSD_CONST0, 0 );
    If_DsdObjAlloc( p, IF_DSD_VAR, 0 )->nSupp = 1;
    p->vTemp1   = Vec_IntAlloc( 32 );
    p->vTemp2   = Vec_IntAlloc( 32 );
    p->pTtElems = If_ManDsdTtElems();
    for ( v = 3; v <= nVars; v++ )
    {
        p->vTtMem[v] = Vec_MemAlloc( Abc_TtWordNum(v), 12 );
        Vec_MemHashAlloc( p->vTtMem[v], 10000 );
        p->vTtDecs[v] = Vec_PtrAlloc( 1000 );
    }
/*
    p->pTtGia   = Gia_ManStart( nVars );
    Gia_ManHashAlloc( p->pTtGia );
    for ( v = 0; v < nVars; v++ )
        Gia_ManAppendCi( p->pTtGia );
*/
    for ( v = 2; v < nVars; v++ )
        p->pSched[v] = Extra_GreyCodeSchedule( v );
    if ( LutSize )
    p->pSat     = If_ManSatBuildXY( LutSize );
    p->vCover   = Vec_IntAlloc( 0 );
    return p;
}